

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian32(CodedInputStream *this,uint32 *value)

{
  bool bVar1;
  int iVar2;
  uint8 *puVar3;
  uint32 *in_RSI;
  CodedInputStream *in_RDI;
  CodedInputStream *value_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  value_00 = in_RDI;
  iVar2 = BufferSize(in_RDI);
  if (iVar2 < 4) {
    bVar1 = ReadLittleEndian32Fallback
                      ((CodedInputStream *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (uint32 *)value_00);
  }
  else {
    puVar3 = ReadLittleEndian32FromArray(in_RDI->buffer_,in_RSI);
    in_RDI->buffer_ = puVar3;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

inline bool CodedInputStream::ReadLittleEndian32(uint32* value) {
#if defined(PROTOBUF_LITTLE_ENDIAN)
  if (PROTOBUF_PREDICT_TRUE(BufferSize() >= static_cast<int>(sizeof(*value)))) {
    buffer_ = ReadLittleEndian32FromArray(buffer_, value);
    return true;
  } else {
    return ReadLittleEndian32Fallback(value);
  }
#else
  return ReadLittleEndian32Fallback(value);
#endif
}